

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

__pid_t __thiscall
so_5::disp::mpmc_queue_traits::combined_lock::actual_cond_t::wait
          (actual_cond_t *this,void *__stat_loc)

{
  bool bVar1;
  actual_cond_t *extraout_RAX;
  undefined1 local_38 [8];
  unique_lock<std::mutex> mutex_lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop_point;
  actual_cond_t *this_local;
  
  this->m_signaled = false;
  stop_point.__d.__r = (duration)(duration)this;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18 = std::chrono::operator+(&local_20,&this->m_waiting_time);
  do {
    spinlock_t<so_5::yield_backoff_t>::unlock(this->m_spinlock);
    std::this_thread::yield();
    spinlock_t<so_5::yield_backoff_t>::lock(this->m_spinlock);
    if ((this->m_signaled & 1U) != 0) goto LAB_004c10e9;
    mutex_lock._8_8_ = std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator>
                      (&local_18,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&mutex_lock._M_owns);
  } while (bVar1);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->m_mutex);
  spinlock_t<so_5::yield_backoff_t>::unlock(this->m_spinlock);
  std::condition_variable::
  wait<so_5::disp::mpmc_queue_traits::combined_lock::actual_cond_t::wait()::_lambda()_1_>
            (&this->m_condition,(unique_lock<std::mutex> *)local_38,(anon_class_8_1_8991fb9c)this);
  spinlock_t<so_5::yield_backoff_t>::lock(this->m_spinlock);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  this = extraout_RAX;
LAB_004c10e9:
  return (__pid_t)this;
}

Assistant:

SO_5_NOEXCEPT override
			{
				using hrc = std::chrono::high_resolution_clock;

				/*
				 * NOTE: spinlock of the parent lock object is already
				 * acquired by the current thread.
				 */
				m_signaled = false;

				//
				// Busy waiting stage.
				//

				// Limitation for busy waiting stage.
				const auto stop_point = hrc::now() + m_waiting_time;

				do
					{
						m_spinlock.unlock();

						std::this_thread::yield();

						m_spinlock.lock();

						if( m_signaled )
							return;
					}
				while( stop_point > hrc::now() );

				// If we are here then busy waiting stage failed (condition
				// is not signaled yet) and we must go to long-time waiting.
				//
				// NOTE: spinlock of the parent lock object is acquired by
				// the current thread.

				//
				// Long-time waiting stage.
				//

				// Personal mutex object must be acquired.
				std::unique_lock< std::mutex > mutex_lock{ m_mutex };
				// Spinlock of the parent lock can be released now.
				m_spinlock.unlock();

				// Wait on condition_variable.
				m_condition.wait( mutex_lock, [this]{ return m_signaled; } );

				// Spinlock must be reacquired to return the parent lock
				// in the state at the call to wait().
				m_spinlock.lock();
			}